

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Protector.cpp
# Opt level: O2

void __thiscall
CppUnit::Protector::reportFailure(Protector *this,ProtectorContext *context,Exception *failure)

{
  Exception *this_00;
  Exception *this_01;
  Message local_100;
  Message local_88;
  
  this_00 = (Exception *)(**(code **)(*(long *)failure + 0x18))(failure);
  this_01 = this_00;
  Exception::message(&local_100,this_00);
  actualMessage(&local_88,(Protector *)this_01,&local_100,context);
  Exception::setMessage(this_00,&local_88);
  Message::~Message(&local_88);
  Message::~Message(&local_100);
  (*(context->m_result->super_SynchronizedObject)._vptr_SynchronizedObject[10])
            (context->m_result,context->m_test,this_00);
  return;
}

Assistant:

void 
Protector::reportFailure( const ProtectorContext &context,
                          const Exception &failure ) const
{
  std::auto_ptr<Exception> actualFailure( failure.clone() );
  actualFailure->setMessage( actualMessage( actualFailure->message(), context ) );
  context.m_result->addFailure( context.m_test, 
                                actualFailure.release() );
}